

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::ValueIteratorBase::isEqual(ValueIteratorBase *this,SelfType *other)

{
  byte bVar1;
  
  bVar1 = (this->current_)._M_node == (other->current_)._M_node;
  if (this->isNull_ != false) {
    bVar1 = (byte)*(undefined4 *)&other->isNull_;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ValueIteratorBase::isEqual(const SelfType& other) const {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  if (isNull_) {
    return other.isNull_;
  }
  return current_ == other.current_;
#else
  if (isArray_)
    return ValueInternalArray::equals(iterator_.array_, other.iterator_.array_);
  return ValueInternalMap::equals(iterator_.map_, other.iterator_.map_);
#endif
}